

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

Tool * anon_unknown.dwarf_375::ChooseTool(string *tool_name)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *suggestion;
  Tool *local_48;
  Tool *tool_2;
  vector<const_char_*,_std::allocator<const_char_*>_> words;
  Tool *tool_1;
  Tool *tool;
  string *tool_name_local;
  
  bVar1 = std::operator==(tool_name,"list");
  if (bVar1) {
    printf("ninja subtools:\n");
    for (tool_1 = ChooseTool::kTools; tool_1->name != (char *)0x0; tool_1 = tool_1 + 1) {
      if (tool_1->desc != (char *)0x0) {
        printf("%10s  %s\n",tool_1->name,tool_1->desc);
      }
    }
    tool_name_local = (string *)0x0;
  }
  else {
    words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &ChooseTool::kTools[0].name;
    while( true ) {
      if (*words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage == (char *)0x0) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&tool_2);
        for (local_48 = ChooseTool::kTools; local_48->name != (char *)0x0; local_48 = local_48 + 1)
        {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&tool_2,&local_48->name)
          ;
        }
        pcVar2 = SpellcheckStringV(tool_name,
                                   (vector<const_char_*,_std::allocator<const_char_*>_> *)&tool_2);
        if (pcVar2 != (char *)0x0) {
          uVar3 = std::__cxx11::string::c_str();
          Fatal("unknown tool \'%s\', did you mean \'%s\'?",uVar3,pcVar2);
        }
        uVar3 = std::__cxx11::string::c_str();
        Fatal("unknown tool \'%s\'",uVar3);
      }
      bVar1 = std::operator==(*words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,tool_name);
      if (bVar1) break;
      words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5;
    }
    tool_name_local =
         (string *)
         words.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  return (Tool *)tool_name_local;
}

Assistant:

const Tool* ChooseTool(const string& tool_name) {
  static const Tool kTools[] = {
    { "browse", "browse dependency graph in a web browser",
      Tool::RUN_AFTER_LOAD, &NinjaMain::ToolBrowse },
#if defined(_MSC_VER)
    { "msvc", "build helper for MSVC cl.exe (EXPERIMENTAL)",
      Tool::RUN_AFTER_FLAGS, &NinjaMain::ToolMSVC },
#endif
    { "clean", "clean built files",
      Tool::RUN_AFTER_LOAD, &NinjaMain::ToolClean },
    { "commands", "list all commands required to rebuild given targets",
      Tool::RUN_AFTER_LOAD, &NinjaMain::ToolCommands },
    { "deps", "show dependencies stored in the deps log",
      Tool::RUN_AFTER_LOGS, &NinjaMain::ToolDeps },
    { "graph", "output graphviz dot file for targets",
      Tool::RUN_AFTER_LOAD, &NinjaMain::ToolGraph },
    { "query", "show inputs/outputs for a path",
      Tool::RUN_AFTER_LOGS, &NinjaMain::ToolQuery },
    { "targets",  "list targets by their rule or depth in the DAG",
      Tool::RUN_AFTER_LOAD, &NinjaMain::ToolTargets },
    { "compdb",  "dump JSON compilation database to stdout",
      Tool::RUN_AFTER_LOAD, &NinjaMain::ToolCompilationDatabase },
    { "recompact",  "recompacts ninja-internal data structures",
      Tool::RUN_AFTER_LOAD, &NinjaMain::ToolRecompact },
    { "restat",  "restats all outputs in the build log",
      Tool::RUN_AFTER_FLAGS, &NinjaMain::ToolRestat },
    { "rules",  "list all rules",
      Tool::RUN_AFTER_LOAD, &NinjaMain::ToolRules },
    { "cleandead",  "clean built files that are no longer produced by the manifest",
      Tool::RUN_AFTER_LOGS, &NinjaMain::ToolCleanDead },
    { "urtle", NULL,
      Tool::RUN_AFTER_FLAGS, &NinjaMain::ToolUrtle },
    { NULL, NULL, Tool::RUN_AFTER_FLAGS, NULL }
  };

  if (tool_name == "list") {
    printf("ninja subtools:\n");
    for (const Tool* tool = &kTools[0]; tool->name; ++tool) {
      if (tool->desc)
        printf("%10s  %s\n", tool->name, tool->desc);
    }
    return NULL;
  }

  for (const Tool* tool = &kTools[0]; tool->name; ++tool) {
    if (tool->name == tool_name)
      return tool;
  }

  vector<const char*> words;
  for (const Tool* tool = &kTools[0]; tool->name; ++tool)
    words.push_back(tool->name);
  const char* suggestion = SpellcheckStringV(tool_name, words);
  if (suggestion) {
    Fatal("unknown tool '%s', did you mean '%s'?",
          tool_name.c_str(), suggestion);
  } else {
    Fatal("unknown tool '%s'", tool_name.c_str());
  }
  return NULL;  // Not reached.
}